

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

char * ucnv_getAlias_63(char *alias,uint16_t n,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  UBool UVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  char *pcVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  bool bVar14;
  char local_78 [72];
  
  UVar6 = haveAliasData(pErrorCode);
  if (UVar6 == '\0') {
    return (char *)0x0;
  }
  if (alias == (char *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (char *)0x0;
  }
  if (*alias == '\0') {
    return (char *)0x0;
  }
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  if (uVar1 != 0) {
    sVar9 = strlen(alias);
    if (0x3b < sVar9) {
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      pcVar10 = (char *)0xffffffff;
      goto LAB_002b8565;
    }
    ucnv_io_stripASCIIForCompare_63(local_78,alias);
    alias = local_78;
  }
  puVar5 = gMainTable.normalizedStringTable;
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.aliasList;
  uVar11 = 0;
  uVar12 = gMainTable.untaggedConvArraySize;
  uVar13 = gMainTable.untaggedConvArraySize >> 1;
  do {
    if (uVar1 == 0) {
      iVar7 = ucnv_compareNames_63(alias,(char *)(puVar4 + puVar3[uVar13]));
    }
    else {
      iVar7 = strcmp(alias,(char *)(puVar5 + puVar3[uVar13]));
    }
    uVar8 = uVar13;
    if ((-1 < iVar7) && (uVar8 = uVar12, uVar11 = uVar13, iVar7 == 0)) {
      uVar2 = gMainTable.untaggedConvArray[uVar13];
      if ((short)uVar2 < 0) {
        *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
      }
      pcVar10 = (char *)(ulong)(uVar2 & 0xfff);
      goto LAB_002b8565;
    }
    uVar12 = uVar8;
    uVar8 = uVar12 + uVar11 >> 1;
    bVar14 = uVar13 != uVar8;
    uVar13 = uVar8;
  } while (bVar14);
  pcVar10 = (char *)0xffffffff;
LAB_002b8565:
  bVar14 = true;
  if (((uint)pcVar10 < gMainTable.converterListSize) &&
     (pcVar10 = (char *)(ulong)gMainTable.taggedAliasArray
                               [(gMainTable.tagListSize - 1) * gMainTable.converterListSize +
                                (uint)pcVar10], pcVar10 != (char *)0x0)) {
    if (n < gMainTable.taggedAliasLists[(long)pcVar10]) {
      pcVar10 = (char *)((ulong)((uint)gMainTable.taggedAliasLists[(long)(pcVar10 + (ulong)n + 1)] *
                                2) + (long)gMainTable.stringTable);
      bVar14 = false;
    }
    else {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  if (bVar14) {
    return (char *)0x0;
  }
  return pcVar10;
}

Assistant:

U_CAPI const char* U_EXPORT2
ucnv_getAlias(const char *alias, uint16_t n, UErrorCode *pErrorCode)
{
    return ucnv_io_getAlias(alias, n, pErrorCode);
}